

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface.cc
# Opt level: O1

int __thiscall RealDiskInterface::RemoveFile(RealDiskInterface *this,string *path)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  
  iVar2 = remove((path->_M_dataplus)._M_p);
  iVar3 = 0;
  if (iVar2 < 0) {
    piVar4 = __errno_location();
    iVar3 = 1;
    if (*piVar4 != 2) {
      pcVar1 = (path->_M_dataplus)._M_p;
      pcVar5 = strerror(*piVar4);
      Error("remove(%s): %s",pcVar1,pcVar5);
      iVar3 = -1;
    }
  }
  return iVar3;
}

Assistant:

int RealDiskInterface::RemoveFile(const string& path) {
  if (remove(path.c_str()) < 0) {
    switch (errno) {
      case ENOENT:
        return 1;
      default:
        Error("remove(%s): %s", path.c_str(), strerror(errno));
        return -1;
    }
  } else {
    return 0;
  }
}